

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O3

bool __thiscall IntView<3>::indomain(IntView<3> *this,int64_t v)

{
  IntVar *pIVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar2 = v / (long)this->a;
  if (v % (long)this->a == 0) {
    lVar3 = -lVar2;
    pIVar1 = this->var;
    lVar4 = (long)(pIVar1->min).v;
    bVar5 = false;
    if ((lVar4 == lVar3 || SBORROW8(lVar4,lVar3) != lVar4 + lVar2 < 0) &&
       (lVar4 = (long)(pIVar1->max).v, bVar5 = false, SBORROW8(lVar4,lVar3) == lVar4 + lVar2 < 0)) {
      if (pIVar1->vals == (Tchar *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = pIVar1->vals[lVar3].v != '\0';
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool indomain(int64_t v) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			if ((v % a) != 0) {
				return false;
			}
			v = v / a;
		}
		if ((type & 1) != 0) {
			v = -v;
		}
		return var->indomain(v);
	}